

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

void __thiscall
soul::ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL>::erase
          (ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL> *this,
          Section *startElement,Section *endElement)

{
  size_t sVar1;
  Section *pSVar2;
  Section *pSVar3;
  Section *pSVar4;
  Section *src;
  Section *pSVar5;
  
  if ((startElement != (Section *)0x0) && (pSVar2 = this->items, pSVar2 <= startElement)) {
    sVar1 = this->numActive;
    pSVar3 = pSVar2 + sVar1;
    if (startElement <= pSVar3) {
      if (((endElement == (Section *)0x0) || (endElement < pSVar2)) || (pSVar3 < endElement)) {
        throwInternalCompilerError
                  ("endElement != nullptr && endElement >= begin() && endElement <= end()","erase",
                   0x125);
      }
      if (startElement == endElement) {
        return;
      }
      if (endElement <= startElement) {
        throwInternalCompilerError("startElement < endElement","erase",0x12a);
      }
      pSVar4 = startElement;
      pSVar5 = endElement;
      if (pSVar3 == endElement) {
        sVar1 = (long)startElement - (long)pSVar2 >> 4;
      }
      else {
        for (; pSVar5 < pSVar2 + sVar1; pSVar5 = pSVar5 + 1) {
          sVar1 = pSVar5->end;
          pSVar4->start = pSVar5->start;
          pSVar4->end = sVar1;
          pSVar2 = this->items;
          sVar1 = this->numActive;
          pSVar4 = pSVar4 + 1;
        }
        sVar1 = sVar1 - ((long)endElement - (long)startElement >> 4);
      }
      shrink(this,sVar1);
      return;
    }
  }
  throwInternalCompilerError
            ("startElement != nullptr && startElement >= begin() && startElement <= end()","erase",
             0x124);
}

Assistant:

void erase (Item* startElement, Item* endElement)
    {
        SOUL_ASSERT (startElement != nullptr && startElement >= begin() && startElement <= end());
        SOUL_ASSERT (endElement != nullptr && endElement >= begin() && endElement <= end());

        if (startElement == endElement)
            return;

        SOUL_ASSERT (startElement < endElement);

        if (endElement == end())
            return shrink ((size_t) (startElement - begin()));

        auto dest = startElement;

        for (auto src = endElement; src < end(); ++dest, ++src)
            *dest = std::move (*src);

        shrink (size() - (size_t) (endElement - startElement));
    }